

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void wasm::SimplifyLocals<true,_false,_true>::visitPost
               (SimplifyLocals<true,_false,_true> *self,Expression **currp)

{
  Expression *pEVar1;
  bool bVar2;
  LocalGet *curr;
  pointer ppVar3;
  LocalSet *this;
  Drop *this_00;
  PassOptions *pPVar4;
  Module *pMVar5;
  size_type sVar6;
  SinkableInfo local_4f8;
  pair<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo> local_380;
  key_type local_200 [2];
  Index index;
  undefined1 local_1f0 [8];
  EffectAnalyzer effects;
  Drop *drop;
  Expression *previousValue;
  LocalSet *previous;
  _Self local_50;
  iterator found;
  LocalSet *set;
  LocalGet *get;
  LocalGet originalGet;
  Expression *original;
  Expression **currp_local;
  SimplifyLocals<true,_false,_true> *self_local;
  
  originalGet._16_8_ = *currp;
  LocalGet::LocalGet((LocalGet *)&get);
  curr = Expression::dynCast<wasm::LocalGet>(*currp);
  if (curr != (LocalGet *)0x0) {
    get = *(LocalGet **)&(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression;
    originalGet.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._0_8_ =
         (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
    originalGet.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression.type.id._0_4_ =
         curr->index;
    originalGet._16_8_ = &get;
    optimizeLocalGet(self,curr);
  }
  found._M_node = (_Base_ptr)Expression::dynCast<wasm::LocalSet>(*currp);
  if (found._M_node != (_Base_ptr)0x0) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
         ::find(&self->sinkables,(key_type *)&(found._M_node)->_M_left);
    previous = (LocalSet *)
               std::
               map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
               ::end(&self->sinkables);
    bVar2 = std::operator!=(&local_50,(_Self *)&previous);
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>
               ::operator->(&local_50);
      this = Expression::cast<wasm::LocalSet>(*(ppVar3->second).item);
      bVar2 = LocalSet::isTee(this);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!previous->isTee()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x1a1,
                      "static void wasm::SimplifyLocals<true, false>::visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = false, allowNesting = true]"
                     );
      }
      pEVar1 = this->value;
      this_00 = ExpressionManipulator::convert<wasm::LocalSet,wasm::Drop>(this);
      this_00->value = pEVar1;
      Drop::finalize(this_00);
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
                   ::erase_abi_cxx11_((map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
                                       *)&self->sinkables,(iterator)local_50._M_node);
      self->anotherCycle = true;
    }
  }
  pPVar4 = Pass::getPassOptions((Pass *)self);
  pMVar5 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                        *)&(self->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                      );
  EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_1f0,pPVar4,pMVar5);
  bVar2 = EffectAnalyzer::checkPost((EffectAnalyzer *)local_1f0,(Expression *)originalGet._16_8_);
  if (bVar2) {
    checkInvalidations(self,(EffectAnalyzer *)local_1f0);
  }
  if ((found._M_node != (_Base_ptr)0x0) && (bVar2 = canSink(self,(LocalSet *)found._M_node), bVar2))
  {
    local_200[0] = *(key_type *)&(found._M_node)->_M_left;
    sVar6 = std::
            map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
            ::count(&self->sinkables,local_200);
    if (sVar6 != 0) {
      __assert_fail("self->sinkables.count(index) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyLocals.cpp"
                    ,0x1b2,
                    "static void wasm::SimplifyLocals<true, false>::visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = false, allowNesting = true]"
                   );
    }
    pPVar4 = Pass::getPassOptions((Pass *)self);
    pMVar5 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
             ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                          *)&(self->
                             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                             ).
                             super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                        );
    SinkableInfo::SinkableInfo(&local_4f8,currp,pPVar4,pMVar5);
    std::pair<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>::
    pair<unsigned_int_&,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_true>
              (&local_380,local_200,&local_4f8);
    std::
    map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
    ::emplace<std::pair<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>
              ((map<unsigned_int,wasm::SimplifyLocals<true,false,true>::SinkableInfo,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wasm::SimplifyLocals<true,false,true>::SinkableInfo>>>
                *)&self->sinkables,&local_380);
    std::pair<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>::~pair
              (&local_380);
    SinkableInfo::~SinkableInfo(&local_4f8);
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1f0);
  return;
}

Assistant:

static void
  visitPost(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
            Expression** currp) {
    // Handling invalidations in the case where the current node is a get
    // that we sink into is not trivial in general. In the simple case,
    // all current sinkables are compatible with each other (otherwise one
    // would have invalidated a previous one, and removed it). Given that, if
    // we sink one of the sinkables, then that new code cannot invalidate any
    // other sinkable - we've already compared them. However, a tricky case
    // is when a sinkable contains another sinkable,
    //
    //  (local.set $x
    //   (block (result i32)
    //    (A (local.get $y))
    //    (local.set $y B)
    //   )
    //  )
    //  (C (local.get $y))
    //  (D (local.get $x))
    //
    // If we sink the set of $y, we have
    //
    //  (local.set $x
    //   (block (result i32)
    //    (A (local.get $y))
    //    (nop)
    //   )
    //  )
    //  (C B)
    //  (D (local.get $x))
    //
    // There is now a risk that the set of $x should be invalidated, because
    // if we sink it then A may happen after B (imagine that B contains
    // something dangerous for that). To verify the risk, we could recursively
    // scan all of B, but that is less efficient. Instead, the key thing is
    // that if we sink out an inner part of a set, we should just leave further
    // work on it to a later iteration. This is achieved by checking for
    // invalidation on the original node, the local.get $y, which is guaranteed
    // to invalidate the parent whose inner part was removed (since the inner
    // part has a set, and the original node is a get of that same local).
    //
    // To implement this, if the current node is a get, note it and use it
    // for invalidations later down. We must note it since optimizing the get
    // may perform arbitrary changes to the graph, including reuse the get.

    Expression* original = *currp;

    LocalGet originalGet;

    if (auto* get = (*currp)->dynCast<LocalGet>()) {
      // Note: no visitor for LocalGet, so that we can handle it here.
      originalGet = *get;
      original = &originalGet;
      self->optimizeLocalGet(get);
    }

    // perform main LocalSet processing here, since we may be the result of
    // replaceCurrent, i.e., no visitor for LocalSet, like LocalGet above.
    auto* set = (*currp)->dynCast<LocalSet>();

    if (set) {
      // if we see a set that was already potentially-sinkable, then the
      // previous store is dead, leave just the value
      auto found = self->sinkables.find(set->index);
      if (found != self->sinkables.end()) {
        auto* previous = (*found->second.item)->template cast<LocalSet>();
        assert(!previous->isTee());
        auto* previousValue = previous->value;
        Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(previous);
        drop->value = previousValue;
        drop->finalize();
        self->sinkables.erase(found);
        self->anotherCycle = true;
      }
    }

    EffectAnalyzer effects(self->getPassOptions(), *self->getModule());
    if (effects.checkPost(original)) {
      self->checkInvalidations(effects);
    }

    if (set && self->canSink(set)) {
      Index index = set->index;
      assert(self->sinkables.count(index) == 0);
      self->sinkables.emplace(std::pair{
        index,
        SinkableInfo(currp, self->getPassOptions(), *self->getModule())});
    }

    if (!allowNesting) {
      self->expressionStack.pop_back();
    }
  }